

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

Var Js::JavascriptString::TrimLeftRightHelper<false,true>
              (JavascriptString *arg,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  char16 *pcVar4;
  JavascriptString *pJVar5;
  undefined4 *puVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  TVar1 = arg->m_charLength;
  pcVar4 = GetString(arg);
  if ((int)(TVar1 - 1) < 0) {
    if (TVar1 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0x9e8,"(idxEnd == -1)","idxEnd == -1");
      if (!bVar3) {
LAB_00d1dc17:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  else {
    iVar7 = 0;
    lVar8 = (ulong)(TVar1 - 1) + 1;
    do {
      bVar3 = IsWhiteSpaceCharacter(pcVar4[lVar8 + -1]);
      if (!bVar3) {
        if (iVar7 != 0) {
          pJVar5 = SubString::New(arg,0,TVar1 - iVar7);
          return pJVar5;
        }
        if ((((((arg->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                      ,0x9f4,"(scriptContext == arg->GetScriptContext())",
                                      "Should have already marshaled the string in cross site thunk"
                                     );
          if (!bVar3) goto LAB_00d1dc17;
          *puVar6 = 0;
        }
        return arg;
      }
      iVar7 = iVar7 + 1;
      lVar9 = lVar8 + -1;
      bVar3 = 0 < lVar8;
      lVar8 = lVar9;
    } while (lVar9 != 0 && bVar3);
  }
  pJVar5 = JavascriptLibrary::GetEmptyString
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  return pJVar5;
}

Assistant:

Var JavascriptString::TrimLeftRightHelper(JavascriptString* arg, ScriptContext* scriptContext)
    {
        static_assert(trimLeft || trimRight, "bad template instance of TrimLeftRightHelper()");

        int len = arg->GetLength();
        const char16 *string = arg->GetString();

        int idxStart = 0;
        if (trimLeft)
        {
            for (; idxStart < len; idxStart++)
            {
                char16 ch = string[idxStart];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (len == idxStart)
            {
                return (scriptContext->GetLibrary()->GetEmptyString());
            }
        }

        int idxEnd = len - 1;
        if (trimRight)
        {
            for (; idxEnd >= 0; idxEnd--)
            {
                char16 ch = string[idxEnd];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (!trimLeft)
            {
                if (idxEnd < 0)
                {
                    Assert(idxEnd == -1);
                    return (scriptContext->GetLibrary()->GetEmptyString());
                }
            }
            else
            {
                Assert(idxEnd >= 0);
            }
        }

        if (idxStart == 0 && idxEnd == len - 1)
        {
            AssertMsg(scriptContext == arg->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return arg;
        }

        return SubstringCore(arg, idxStart, idxEnd - idxStart + 1, scriptContext);
    }